

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_queue.hpp
# Opt level: O2

void __thiscall
asio::detail::
timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::get_all_timers(timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                 *this,op_queue<asio::detail::scheduler_operation> *ops)

{
  per_timer_data *q;
  pointer phVar1;
  per_timer_data *timer;
  
  while (q = this->timers_, q != (per_timer_data *)0x0) {
    this->timers_ = q->next_;
    op_queue<asio::detail::scheduler_operation>::push<asio::detail::wait_op>(ops,&q->op_queue_);
    q->next_ = (per_timer_data *)0x0;
    q->prev_ = (per_timer_data *)0x0;
  }
  phVar1 = (this->heap_).
           super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->heap_).
      super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
      ._M_impl.super__Vector_impl_data._M_finish != phVar1) {
    (this->heap_).
    super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = phVar1;
  }
  return;
}

Assistant:

virtual void get_all_timers(op_queue<operation>& ops)
  {
    while (timers_)
    {
      per_timer_data* timer = timers_;
      timers_ = timers_->next_;
      ops.push(timer->op_queue_);
      timer->next_ = 0;
      timer->prev_ = 0;
    }

    heap_.clear();
  }